

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar m;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_ge q;
  secp256k1_gej pr;
  secp256k1_fe aux [4];
  secp256k1_gej pubkeyj;
  uchar c [32];
  secp256k1_strauss_point_state ps [1];
  secp256k1_scalar local_878;
  uint local_874;
  secp256k1_scalar local_870;
  secp256k1_scalar local_86c;
  secp256k1_scalar local_868;
  secp256k1_scalar local_864;
  secp256k1_strauss_state local_860;
  secp256k1_ge local_848;
  secp256k1_gej local_7e0;
  secp256k1_fe local_748 [4];
  secp256k1_gej local_680;
  secp256k1_ge local_5e8 [4];
  secp256k1_strauss_point_state local_448;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_verify_cold_4();
  }
  else if (msghash32 != (uchar *)0x0) {
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_verify_cold_2();
      return 0;
    }
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_ecdsa_verify_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_870,msghash32,(int *)0x0);
    secp256k1_scalar_set_b32(&local_878,sig->data,(int *)0x0);
    secp256k1_scalar_set_b32(&local_874,sig->data + 0x20,(int *)0x0);
    secp256k1_scalar_verify(&local_874);
    if (6 < local_874) {
      return 0;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&local_848,pubkey);
    if (iVar1 != 0) {
      secp256k1_scalar_verify(&local_878);
      if (local_878 == 0) {
        return 0;
      }
      secp256k1_scalar_verify(&local_874);
      if (local_874 != 0) {
        secp256k1_scalar_verify(&local_874);
        secp256k1_scalar_inverse(&local_864,&local_874);
        secp256k1_scalar_verify(&local_864);
        secp256k1_scalar_mul(&local_868,&local_864,&local_870);
        secp256k1_scalar_mul(&local_86c,&local_864,&local_878);
        secp256k1_gej_set_ge(&local_680,&local_848);
        local_860.aux = local_748;
        local_860.pre_a = local_5e8;
        local_860.ps = &local_448;
        secp256k1_ecmult_strauss_wnaf(&local_860,&local_7e0,1,&local_680,&local_86c,&local_868);
        secp256k1_gej_verify(&local_7e0);
        if (local_7e0.infinity == 0) {
          secp256k1_ge_set_gej((secp256k1_ge *)&local_448,&local_7e0);
          secp256k1_fe_normalize((secp256k1_fe *)&local_448);
          secp256k1_fe_get_b32((uchar *)local_5e8,(secp256k1_fe *)&local_448);
          secp256k1_scalar_set_b32((secp256k1_scalar *)local_748,(uchar *)local_5e8,(int *)0x0);
          secp256k1_scalar_verify(&local_878);
          secp256k1_scalar_verify((secp256k1_scalar *)local_748);
          return (uint)(local_878 == (secp256k1_scalar)local_748[0].n[0]);
        }
        return 0;
      }
      return 0;
    }
    return 0;
  }
  secp256k1_ecdsa_verify_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}